

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall V1Transport::readHeader(V1Transport *this,Span<const_unsigned_char> msg_bytes)

{
  long lVar1;
  string_view str;
  ConstevalFormatString<2U> fmt;
  ConstevalFormatString<3U> fmt_00;
  bool bVar2;
  uint *puVar3;
  reference __dest;
  uchar *__src;
  size_t in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var4;
  Level unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  uint *in_stack_00000018;
  long *in_stack_00000020;
  exception *anon_var_0;
  uint nCopy;
  uint nRemaining;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 uVar5;
  int in_stack_fffffffffffffe5c;
  CMessageHeader *in_stack_fffffffffffffe60;
  DataStream *in_stack_fffffffffffffe68;
  array<unsigned_char,_4UL> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  CMessageHeader *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  LogFlags in_stack_fffffffffffffec0;
  char *flag;
  undefined8 in_stack_fffffffffffffec8;
  int iVar6;
  Span<const_unsigned_char> in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  uint uVar7;
  string_view in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff20;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe5c,(AnnotatedMixin<std::mutex> *)0x20765d);
  Span<const_unsigned_char>::size
            ((Span<const_unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  puVar3 = std::min<unsigned_int>
                     ((uint *)in_stack_fffffffffffffe60,
                      (uint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  uVar7 = *puVar3;
  __dest = DataStream::operator[](in_stack_fffffffffffffe68,(size_type)in_stack_fffffffffffffe60);
  __src = Span<const_unsigned_char>::data
                    ((Span<const_unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  memcpy(__dest,__src,(ulong)uVar7);
  *(uint *)(in_RDI + 0x128) = uVar7 + *(int *)(in_RDI + 0x128);
  if (0x17 < *(uint *)(in_RDI + 0x128)) {
    DataStream::operator>>(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    bVar2 = std::operator==((array<unsigned_char,_4UL> *)in_stack_fffffffffffffe78,
                            in_stack_fffffffffffffe70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      if ((*(uint *)(in_RDI + 0x100) < 0x2000001) && (*(uint *)(in_RDI + 0x100) < 0x3d0901)) {
        *(undefined1 *)(in_RDI + 200) = 1;
      }
      else {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                     (char *)in_stack_fffffffffffffe70);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                     (char *)in_stack_fffffffffffffe70);
          iVar6 = 0;
          CMessageHeader::GetCommand_abi_cxx11_(in_stack_fffffffffffffe98);
          _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffffe78);
          flag = _Var4._M_str;
          str._M_str = (char *)_Var4._M_len;
          str._M_len = in_RDI;
          SanitizeString_abi_cxx11_(str,in_stack_fffffffffffffea4);
          uVar5 = 1;
          fmt_00.fmt._4_4_ = in_stack_ffffffffffffff0c;
          fmt_00.fmt._0_4_ = in_stack_ffffffffffffff08;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_int,long>
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff10,iVar6,(LogFlags)flag,
                     unaff_retaddr,fmt_00,in_stack_00000010,in_stack_00000018,in_stack_00000020);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,uVar5));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,uVar5));
        }
        uVar7 = 0xffffffff;
      }
    }
    else {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                   (char *)in_stack_fffffffffffffe70);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe78,
                   (char *)in_stack_fffffffffffffe70);
        Span<unsigned_char_const>::Span<std::array<unsigned_char,4ul>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffe68,
                   &in_stack_fffffffffffffe60->pchMessageStart,
                   (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        HexStr_abi_cxx11_(in_stack_fffffffffffffee0);
        uVar5 = 1;
        fmt.fmt._4_4_ = in_stack_ffffffffffffff0c;
        fmt.fmt._0_4_ = in_stack_ffffffffffffff08;
        LogPrintFormatInternal<std::__cxx11::string,long>
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff10,iVar6,
                   in_stack_fffffffffffffec0,unaff_retaddr,fmt,in_stack_00000010,
                   (long *)in_stack_00000018);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,uVar5));
      }
      uVar7 = 0xffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar7;
}

Assistant:

int V1Transport::readHeader(Span<const uint8_t> msg_bytes)
{
    AssertLockHeld(m_recv_mutex);
    // copy data to temporary parsing buffer
    unsigned int nRemaining = CMessageHeader::HEADER_SIZE - nHdrPos;
    unsigned int nCopy = std::min<unsigned int>(nRemaining, msg_bytes.size());

    memcpy(&hdrbuf[nHdrPos], msg_bytes.data(), nCopy);
    nHdrPos += nCopy;

    // if header incomplete, exit
    if (nHdrPos < CMessageHeader::HEADER_SIZE)
        return nCopy;

    // deserialize to CMessageHeader
    try {
        hdrbuf >> hdr;
    }
    catch (const std::exception&) {
        LogDebug(BCLog::NET, "Header error: Unable to deserialize, peer=%d\n", m_node_id);
        return -1;
    }

    // Check start string, network magic
    if (hdr.pchMessageStart != m_magic_bytes) {
        LogDebug(BCLog::NET, "Header error: Wrong MessageStart %s received, peer=%d\n", HexStr(hdr.pchMessageStart), m_node_id);
        return -1;
    }

    // reject messages larger than MAX_SIZE or MAX_PROTOCOL_MESSAGE_LENGTH
    if (hdr.nMessageSize > MAX_SIZE || hdr.nMessageSize > MAX_PROTOCOL_MESSAGE_LENGTH) {
        LogDebug(BCLog::NET, "Header error: Size too large (%s, %u bytes), peer=%d\n", SanitizeString(hdr.GetCommand()), hdr.nMessageSize, m_node_id);
        return -1;
    }

    // switch state to reading message data
    in_data = true;

    return nCopy;
}